

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O3

int mriStep_GetNumRhsEvals(ARKodeMem ark_mem,int partition_index,long *rhs_evals)

{
  int iVar1;
  long lVar2;
  char *msgfmt;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem local_28;
  
  local_28 = (ARKodeMRIStepMem)0x0;
  iVar1 = mriStep_AccessStepMem(ark_mem,"mriStep_GetNumRhsEvals",&local_28);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (rhs_evals == (long *)0x0) {
    msgfmt = "rhs_evals is NULL";
    iVar1 = 0x93;
  }
  else {
    if (partition_index < 2) {
      if (partition_index == 1) {
        lVar2 = local_28->nfsi;
      }
      else {
        if (partition_index != 0) {
          *rhs_evals = local_28->nfsi + local_28->nfse;
          return 0;
        }
        lVar2 = local_28->nfse;
      }
      *rhs_evals = lVar2;
      return 0;
    }
    msgfmt = "Invalid partition index";
    iVar1 = 0x9a;
  }
  arkProcessError(ark_mem,-0x16,iVar1,"mriStep_GetNumRhsEvals",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep_io.c"
                  ,msgfmt);
  return -0x16;
}

Assistant:

int mriStep_GetNumRhsEvals(ARKodeMem ark_mem, int partition_index,
                           long int* rhs_evals)
{
  ARKodeMRIStepMem step_mem = NULL;

  /* access ARKodeMRIStepMem structure */
  int retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  if (rhs_evals == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "rhs_evals is NULL");
    return ARK_ILL_INPUT;
  }

  if (partition_index > 1)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Invalid partition index");
    return ARK_ILL_INPUT;
  }

  switch (partition_index)
  {
  case 0: *rhs_evals = step_mem->nfse; break;
  case 1: *rhs_evals = step_mem->nfsi; break;
  default: *rhs_evals = step_mem->nfse + step_mem->nfsi; break;
  }

  return ARK_SUCCESS;
}